

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

void __thiscall re2::Compiler::Compiler(Compiler *this)

{
  int iVar1;
  Prog *this_00;
  
  (this->super_Walker<re2::Frag>)._vptr_Walker = (_func_int **)&PTR__Walker_002abe48;
  (this->super_Walker<re2::Frag>).stack_.c.
  super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->super_Walker<re2::Frag>).stack_.c.
  super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->super_Walker<re2::Frag>).stack_.c.
  super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_Walker<re2::Frag>).stack_.c.
           super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_Walker<re2::Frag>).stack_.c.
           super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->super_Walker<re2::Frag>).stack_.c.
           super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->super_Walker<re2::Frag>).stack_.c.
  super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_Walker<re2::Frag>).stack_.c.
           super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_Walker<re2::Frag>).stack_.c.
           super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->super_Walker<re2::Frag>).stack_.c.
           super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::_Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>::
  _M_initialize_map((_Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                     *)&(this->super_Walker<re2::Frag>).stack_,0);
  (this->super_Walker<re2::Frag>).stopped_early_ = false;
  (this->super_Walker<re2::Frag>)._vptr_Walker = (_func_int **)&PTR__Compiler_002abde0;
  *(undefined8 *)
   &(this->inst_).ptr_._M_t.
    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter> = 0;
  (this->inst_).ptr_._M_t.
  super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
  super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
  super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl = (Inst *)0x0;
  (this->rune_cache_)._M_h._M_buckets = &(this->rune_cache_)._M_h._M_single_bucket;
  (this->rune_cache_)._M_h._M_bucket_count = 1;
  (this->rune_cache_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rune_cache_)._M_h._M_element_count = 0;
  (this->rune_cache_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rune_cache_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rune_cache_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->rune_cache_)._M_h._M_single_bucket + 5) = 0;
  *(undefined8 *)((long)&(this->rune_range_).end.head + 1) = 0;
  this_00 = (Prog *)operator_new(0x1b0);
  Prog::Prog(this_00);
  this->prog_ = this_00;
  this->failed_ = false;
  this->encoding_ = kEncodingUTF8;
  this->reversed_ = false;
  this->ninst_ = 0;
  this->max_ninst_ = 1;
  this->max_mem_ = 0;
  iVar1 = AllocInst(this,1);
  Prog::Inst::InitFail
            ((this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + iVar1);
  this->max_ninst_ = 0;
  return;
}

Assistant:

Compiler::Compiler() {
  prog_ = new Prog();
  failed_ = false;
  encoding_ = kEncodingUTF8;
  reversed_ = false;
  ninst_ = 0;
  max_ninst_ = 1;  // make AllocInst for fail instruction okay
  max_mem_ = 0;
  int fail = AllocInst(1);
  inst_[fail].InitFail();
  max_ninst_ = 0;  // Caller must change
}